

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ec_seckey_tweak_add(secp256k1_context *ctx,uchar *seckey,uchar *tweak32)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint uVar5;
  ulong uVar6;
  int overflow;
  secp256k1_scalar sec;
  int local_5c;
  secp256k1_scalar local_58;
  
  if (seckey == (uchar *)0x0) {
    secp256k1_ec_seckey_tweak_add_cold_2();
  }
  else {
    if (tweak32 != (uchar *)0x0) {
      secp256k1_scalar_set_b32(&local_58,seckey,&local_5c);
      uVar4 = local_58.d[3];
      uVar3 = local_58.d[2];
      uVar2 = local_58.d[1];
      uVar1 = local_58.d[0];
      uVar5 = secp256k1_ec_seckey_tweak_add_helper(&local_58,tweak32);
      if (((uVar2 == 0 && uVar1 == 0) && uVar3 == 0) && uVar4 == 0) {
        uVar5 = 0;
      }
      if (local_5c != 0) {
        uVar5 = 0;
      }
      uVar6 = (ulong)(uVar5 ^ 1) - 1;
      local_58.d[0] = local_58.d[0] & uVar6;
      local_58.d[1] = local_58.d[1] & uVar6;
      local_58.d[2] = local_58.d[2] & uVar6;
      local_58.d[3] = local_58.d[3] & uVar6;
      secp256k1_scalar_get_b32(seckey,&local_58);
      return uVar5;
    }
    secp256k1_ec_seckey_tweak_add_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ec_seckey_tweak_add(const secp256k1_context* ctx, unsigned char *seckey, const unsigned char *tweak32) {
    secp256k1_scalar sec;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);
    ARG_CHECK(tweak32 != NULL);

    ret = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    ret &= secp256k1_ec_seckey_tweak_add_helper(&sec, tweak32);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_get_b32(seckey, &sec);

    secp256k1_scalar_clear(&sec);
    return ret;
}